

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  string *psVar6;
  UnknownFieldSet *this_01;
  size_type *psVar7;
  ulong *puVar8;
  long *plVar9;
  _func_int **pp_Var10;
  _func_void_FieldDescriptor_ptr *p_Var11;
  FieldDescriptor *pFVar12;
  string serial;
  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  Parser parser;
  LogFinisher local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  ErrorCollector local_140;
  ulong *local_138;
  _func_int *local_130;
  ulong auStack_128 [2];
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [2];
  Finder local_e0;
  DescriptorBuilder *local_d8;
  string local_d0;
  Parser local_b0;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  undefined1 local_50 [32];
  MessageLite *this_00;
  
  if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 4) == 0) {
    std::operator+(&local_160,"Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0.field_2._8_8_ = plVar3[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,**(ulong **)option_field);
    plVar9 = plVar3 + 2;
    if ((ParseInfoTree **)*plVar3 == (ParseInfoTree **)plVar9) {
      local_b0.parse_info_tree_ = (ParseInfoTree *)*plVar9;
      local_b0._24_8_ = plVar3[3];
      local_b0.error_collector_ = (ErrorCollector *)&local_b0.parse_info_tree_;
    }
    else {
      local_b0.parse_info_tree_ = (ParseInfoTree *)*plVar9;
      local_b0.error_collector_ = (ErrorCollector *)*plVar3;
    }
    local_b0.finder_ = (Finder *)plVar3[1];
    *plVar3 = (long)plVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    pp_Var10 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var10) {
      local_130 = *pp_Var10;
      auStack_128[0] = plVar3[3];
      local_140._vptr_ErrorCollector = &local_130;
    }
    else {
      local_130 = *pp_Var10;
      local_140._vptr_ErrorCollector = (_func_int **)*plVar3;
    }
    local_138 = (ulong *)plVar3[1];
    *plVar3 = (long)pp_Var10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_140,**(ulong **)option_field);
    p_Var11 = (_func_void_FieldDescriptor_ptr *)(plVar3 + 2);
    if ((_func_void_FieldDescriptor_ptr *)*plVar3 == p_Var11) {
      local_108[0]._0_8_ = *(undefined8 *)p_Var11;
      local_108[0]._8_8_ = plVar3[3];
      local_118._0_8_ = local_118 + 0x10;
    }
    else {
      local_108[0]._0_8_ = *(undefined8 *)p_Var11;
      local_118._0_8_ = (_func_void_FieldDescriptor_ptr *)*plVar3;
    }
    local_118._8_8_ = plVar3[1];
    *plVar3 = (long)p_Var11;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_118);
    pFVar12 = (FieldDescriptor *)(plVar3 + 2);
    if ((FieldDescriptor *)*plVar3 == pFVar12) {
      local_78[0]._0_8_ = *(undefined8 *)pFVar12;
      local_78[0]._8_8_ = plVar3[3];
      local_88._0_8_ = (FieldDescriptor *)(local_88 + 0x10);
    }
    else {
      local_78[0]._0_8_ = *(undefined8 *)pFVar12;
      local_88._0_8_ = (FieldDescriptor *)*plVar3;
    }
    local_88._8_8_ = plVar3[1];
    *plVar3 = (long)pFVar12;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_88);
    if ((FieldDescriptor *)local_88._0_8_ != (FieldDescriptor *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_140._vptr_ErrorCollector != &local_130) {
      operator_delete(local_140._vptr_ErrorCollector);
    }
    if (local_b0.error_collector_ != (ErrorCollector *)&local_b0.parse_info_tree_) {
      operator_delete(local_b0.error_collector_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    bVar1 = false;
  }
  else {
    if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
      local_88._0_8_ = option_field;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                 (FieldDescriptor **)local_88);
    }
    pMVar4 = DynamicMessageFactory::GetPrototype
                       (&this->dynamic_factory_,*(Descriptor **)(option_field + 0x68));
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
    this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    if (this_00 == (MessageLite *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_88,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b5e);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)local_88,"CHECK failed: dynamic.get() != nullptr: ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"Could not create an instance of ");
      local_118._0_8_ = local_118._0_8_ & 0xffffffffff000000;
      FieldDescriptor::DebugStringWithOptions_abi_cxx11_
                (&local_d0,option_field,(DebugStringOptions *)local_118);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_d0);
      internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if (this_00 == (MessageLite *)0x0) {
      internal::LogMessage::~LogMessage((LogMessage *)local_88);
    }
    local_140._vptr_ErrorCollector = (_func_int **)&PTR__AggregateErrorCollector_0067fff0;
    local_130 = (_func_int *)0x0;
    auStack_128[0] = auStack_128[0] & 0xffffffffffffff00;
    local_e0._vptr_Finder = (_func_int **)&PTR__Finder_00680038;
    local_d8 = this->builder_;
    local_138 = auStack_128;
    TextFormat::Parser::Parser(&local_b0);
    local_b0.error_collector_ = &local_140;
    local_b0.finder_ = &local_e0;
    bVar1 = TextFormat::Parser::ParseFromString
                      (&local_b0,(this->uninterpreted_option_->aggregate_value_).ptr_,
                       (Message *)this_00);
    if (bVar1) {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      local_160._M_string_length = 0;
      local_160.field_2._M_allocated_capacity =
           local_160.field_2._M_allocated_capacity & 0xffffffffffffff00;
      MessageLite::SerializeToString(this_00,&local_160);
      if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
        local_118._0_8_ = FieldDescriptor::TypeOnceInit;
        local_50._0_8_ = option_field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(option_field + 0x30),(_func_void_FieldDescriptor_ptr **)local_118
                   ,(FieldDescriptor **)local_50);
      }
      if (*(int *)(option_field + 0x38) == 0xb) {
        psVar6 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                           (unknown_fields,*(int *)(option_field + 0x44));
        std::__cxx11::string::_M_assign((string *)psVar6);
      }
      else {
        if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
          local_118._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50._0_8_ = option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(option_field + 0x30),
                     (_func_void_FieldDescriptor_ptr **)local_118,(FieldDescriptor **)local_50);
        }
        if (*(int *)(option_field + 0x38) != 10) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_118,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1b72);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_118,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=(&local_161,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_118);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x44));
        UnknownFieldSet::ParseFromArray
                  (this_01,local_160._M_dataplus._M_p,(int)local_160._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      plVar3 = (long *)std::__cxx11::string::append(local_50);
      puVar8 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_160.field_2._M_allocated_capacity = *puVar8;
        local_160.field_2._8_8_ = plVar3[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *puVar8;
        local_160._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_160._M_string_length = plVar3[1];
      *plVar3 = (long)puVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_138);
      p_Var11 = (_func_void_FieldDescriptor_ptr *)(plVar3 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*plVar3 == p_Var11) {
        local_108[0]._0_8_ = *(undefined8 *)p_Var11;
        local_108[0]._8_8_ = plVar3[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_108[0]._0_8_ = *(undefined8 *)p_Var11;
        local_118._0_8_ = (_func_void_FieldDescriptor_ptr *)*plVar3;
      }
      local_118._8_8_ = plVar3[1];
      *plVar3 = (long)p_Var11;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
    TextFormat::Parser::~Parser(&local_b0);
    TextFormat::Finder::~Finder(&local_e0);
    local_140._vptr_ErrorCollector = (_func_int **)&PTR__AggregateErrorCollector_0067fff0;
    if (local_138 != auStack_128) {
      operator_delete(local_138);
    }
    io::ErrorCollector::~ErrorCollector(&local_140);
    if (this_00 != (MessageLite *)0x0) {
      (*this_00->_vptr_MessageLite[1])(this_00);
    }
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" +
                         option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" +
                         option_field->name() + ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}